

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

size_t __thiscall jrtplib::RTCPSDESPacket::GetPRIVValueLength(RTCPSDESPacket *this)

{
  byte bVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  
  if ((((this->super_RTCPPacket).knownformat == true) &&
      (puVar2 = this->currentchunk, puVar2 != (uint8_t *)0x0)) &&
     (sVar3 = this->itemoffset, puVar2[sVar3] == '\b')) {
    bVar1 = puVar2[sVar3 + 1];
    if ((ulong)bVar1 != 0) {
      sVar4 = 0;
      if ((uint)puVar2[sVar3 + 2] <= bVar1 - 1) {
        sVar4 = ~(ulong)puVar2[sVar3 + 2] + (ulong)bVar1;
      }
      return sVar4;
    }
  }
  return 0;
}

Assistant:

inline size_t RTCPSDESPacket::GetPRIVValueLength() const
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid != RTCP_SDES_ID_PRIVATE)
		return 0;
	if (sdeshdr->length == 0)
		return 0;
	uint8_t *preflen = currentchunk+itemoffset+sizeof(RTCPSDESHeader);
	size_t prefixlength = (size_t)(*preflen);
	if (prefixlength > (size_t)((sdeshdr->length)-1))
		return 0;
	return ((size_t)(sdeshdr->length))-prefixlength-1;
}